

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_recvmsg(nng_socket s,nng_msg **msgp,int flags)

{
  nng_msg *pnVar1;
  undefined1 local_1f0 [8];
  nni_aio aio;
  nni_sock *sock;
  int rv;
  int flags_local;
  nng_msg **msgp_local;
  nng_socket s_local;
  
  msgp_local._4_4_ = nni_sock_find((nni_sock **)&aio.a_reap_node,s.id);
  if (msgp_local._4_4_ == NNG_OK) {
    nni_aio_init((nni_aio *)local_1f0,(nni_cb)0x0,(void *)0x0);
    if ((flags & 2U) == 0) {
      nng_aio_set_timeout((nng_aio *)local_1f0,-2);
    }
    else {
      nng_aio_set_timeout((nng_aio *)local_1f0,0);
    }
    nni_sock_recv((nni_sock *)aio.a_reap_node.rn_next,(nni_aio *)local_1f0);
    nni_sock_rele((nni_sock *)aio.a_reap_node.rn_next);
    nni_aio_wait((nni_aio *)local_1f0);
    sock._0_4_ = nni_aio_result((nni_aio *)local_1f0);
    if ((nng_err)sock == NNG_OK) {
      pnVar1 = nng_aio_get_msg((nng_aio *)local_1f0);
      *msgp = pnVar1;
    }
    else if (((nng_err)sock == NNG_ETIMEDOUT) && ((flags & 2U) == 2)) {
      sock._0_4_ = NNG_EAGAIN;
    }
    nni_aio_fini((nni_aio *)local_1f0);
    msgp_local._4_4_ = (nng_err)sock;
  }
  return msgp_local._4_4_;
}

Assistant:

int
nng_recvmsg(nng_socket s, nng_msg **msgp, int flags)
{
	int       rv;
	nni_sock *sock;
	nni_aio   aio;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}

	nni_aio_init(&aio, NULL, NULL);
	if (flags & NNG_FLAG_NONBLOCK) {
		nng_aio_set_timeout(&aio, NNG_DURATION_ZERO);
	} else {
		nng_aio_set_timeout(&aio, NNG_DURATION_DEFAULT);
	}
	nni_sock_recv(sock, &aio);
	nni_sock_rele(sock);

	nni_aio_wait(&aio);

	if ((rv = nni_aio_result(&aio)) == 0) {
		*msgp = nng_aio_get_msg(&aio);

	} else if ((rv == NNG_ETIMEDOUT) &&
	    ((flags & NNG_FLAG_NONBLOCK) == NNG_FLAG_NONBLOCK)) {
		rv = NNG_EAGAIN;
	}
	nni_aio_fini(&aio);

	return (rv);
}